

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QTlsBackend * QSslSocketPrivate::tlsBackendInUse(void)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  ConnectionType unaff_retaddr;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QMutexLocker<QMutex> locker;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  QString *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  QTlsBackend *local_78;
  Connection local_68;
  char local_60 [16];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb0;
  ContextType *in_stack_ffffffffffffffb8;
  Object *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  offset_in_QObject_to_subr in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (QMutex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (tlsBackend == (QTlsBackend *)0x0) {
    qVar3 = QString::size(&activeBackendName);
    if (qVar3 == 0) {
      QTlsBackend::defaultBackendName();
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x3a389e);
    }
    qVar3 = QString::size(&activeBackendName);
    if (qVar3 == 0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      while( true ) {
        bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar2) break;
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a3907);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff64,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (char *)0x3a391d);
        QMessageLogger::warning(local_60,"No functional TLS backend was found");
      }
      local_78 = (QTlsBackend *)0x0;
    }
    else {
      tlsBackend = QTlsBackend::findBackend(in_stack_ffffffffffffff68);
      if (tlsBackend != (QTlsBackend *)0x0) {
        QObject::connect<void(QObject::*)(QObject*),QSslSocketPrivate::tlsBackendInUse()::__0>
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0,unaff_retaddr);
        QMetaObject::Connection::~Connection(&local_68);
      }
      local_78 = tlsBackend;
    }
  }
  else {
    local_78 = tlsBackend;
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_78;
  }
  __stack_chk_fail();
}

Assistant:

QTlsBackend *QSslSocketPrivate::tlsBackendInUse()
{
    const QMutexLocker locker(&backendMutex);
    if (tlsBackend)
        return tlsBackend;

    if (!activeBackendName.size())
        activeBackendName = QTlsBackend::defaultBackendName();

    if (!activeBackendName.size()) {
        qCWarning(lcSsl, "No functional TLS backend was found");
        return nullptr;
    }

    tlsBackend = QTlsBackend::findBackend(activeBackendName);
    if (tlsBackend) {
        QObject::connect(tlsBackend, &QObject::destroyed, tlsBackend, [] {
            const QMutexLocker locker(&backendMutex);
            tlsBackend = nullptr;
        },
        Qt::DirectConnection);
    }
    return tlsBackend;
}